

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::GetPointerTypeInfo
          (ValidationState_t *this,uint32_t id,uint32_t *data_type,StorageClass *storage_class)

{
  Op OVar1;
  StorageClass SVar2;
  uint32_t uVar3;
  Instruction *this_00;
  Instruction *inst;
  StorageClass *storage_class_local;
  uint32_t *data_type_local;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  *storage_class = Max;
  if (id == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = FindDef(this,id);
    if (this_00 == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x4c2,
                    "bool spvtools::val::ValidationState_t::GetPointerTypeInfo(uint32_t, uint32_t *, spv::StorageClass *) const"
                   );
    }
    OVar1 = val::Instruction::opcode(this_00);
    if (OVar1 == OpTypeUntypedPointerKHR) {
      SVar2 = val::Instruction::word(this_00,2);
      *storage_class = SVar2;
      *data_type = 0;
      this_local._7_1_ = true;
    }
    else {
      OVar1 = val::Instruction::opcode(this_00);
      if (OVar1 == OpTypePointer) {
        SVar2 = val::Instruction::word(this_00,2);
        *storage_class = SVar2;
        uVar3 = val::Instruction::word(this_00,3);
        *data_type = uVar3;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::GetPointerTypeInfo(
    uint32_t id, uint32_t* data_type, spv::StorageClass* storage_class) const {
  *storage_class = spv::StorageClass::Max;
  if (!id) return false;

  const Instruction* inst = FindDef(id);
  assert(inst);
  if (inst->opcode() == spv::Op::OpTypeUntypedPointerKHR) {
    *storage_class = spv::StorageClass(inst->word(2));
    *data_type = 0;
    return true;
  }

  if (inst->opcode() != spv::Op::OpTypePointer) return false;

  *storage_class = spv::StorageClass(inst->word(2));
  *data_type = inst->word(3);
  return true;
}